

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 floatx80_to_float64_m68k(floatx80 a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  float64 fVar3;
  ushort uVar4;
  int zExp;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar5 = a.low;
  uVar4 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar5)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    return 0x7fffffffffffffff;
  }
  uVar1 = (a._8_8_ & 0xffff) >> 0xf;
  if (uVar4 != 0x7fff) {
    iVar6 = uVar4 - 0x3c01;
    zExp = 0;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
      zExp = iVar6;
    }
    if (uVar5 != 0) {
      zExp = iVar6;
    }
    fVar3 = roundAndPackFloat64((flag)uVar1,zExp,(ulong)((uint)a.low & 1) | uVar5 >> 1,status);
    return fVar3;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
    return uVar1 << 0x3f | 0x7ff0000000000000;
  }
  if ((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0) &&
     (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  uVar7 = 0;
  uVar2 = 0xfffffffffffffffe;
  if ((long)uVar5 < 0) {
    uVar7 = uVar1 << 0x3f;
    uVar2 = uVar5 * 2;
  }
  fVar3 = uVar2 >> 0xc | uVar7 | 0x7ff0000000000000;
  if (status->default_nan_mode != '\0') {
    fVar3 = 0x7fffffffffffffff;
  }
  if (uVar2 < 0x1000) {
    fVar3 = 0x7fffffffffffffff;
  }
  return fVar3;
}

Assistant:

float64 floatx80_to_float64(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig, zSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( aSig<<1 ) ) {
            return commonNaNToFloat64(floatx80ToCommonNaN(a, status), status);
        }
        return packFloat64( aSign, 0x7FF, 0 );
    }
    shift64RightJamming( aSig, 1, &zSig );
    if ( aExp || aSig ) aExp -= 0x3C01;
    return roundAndPackFloat64(aSign, aExp, zSig, status);

}